

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Bytes __thiscall Omega_h::bit_neg_each(Omega_h *this,Bytes *a)

{
  void *extraout_RDX;
  Bytes BVar1;
  Write<signed_char> local_d0;
  undefined1 local_c0 [8];
  type f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<signed_char> b;
  Bytes *a_local;
  LO local_20;
  LO local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (LO)((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(a->write_).shared_alloc_.alloc >> 3);
  }
  b.shared_alloc_.direct_ptr = a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_68,local_10,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_c0,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)&f.b.shared_alloc_.direct_ptr,a);
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = (LO)((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (LO)((ulong)(a->write_).shared_alloc_.alloc >> 3);
  }
  parallel_for<Omega_h::bit_neg_each(Omega_h::Read<signed_char>)::__0>
            (local_20,(type *)local_c0,"bit_neg_each");
  Write<signed_char>::Write(&local_d0,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_d0);
  Write<signed_char>::~Write(&local_d0);
  bit_neg_each(Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_c0);
  Write<signed_char>::~Write((Write<signed_char> *)local_68);
  BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar1.write_.shared_alloc_;
}

Assistant:

Bytes bit_neg_each(Bytes a) {
  Write<I8> b(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = ~(a[i]); };
  parallel_for(a.size(), f, "bit_neg_each");
  return b;
}